

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void cos1D_display<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  int iVar1;
  IMLE<1,_1,_FastLinearExpert> *imle_obj;
  void *pvVar2;
  ostream *poVar3;
  ostream *poVar4;
  IMLE<1,_1,_FastLinearExpert> *in_RDI;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_00000238;
  ostream *in_stack_00000240;
  
  imle_obj = (IMLE<1,_1,_FastLinearExpert> *)
             std::operator<<((ostream *)&std::cout,"Input dimension: ");
  iVar1 = IMLE<1,_1,_FastLinearExpert>::inputDim(in_RDI);
  pvVar2 = (void *)std::ostream::operator<<(imle_obj,iVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Output dimension: ");
  iVar1 = IMLE<1,_1,_FastLinearExpert>::outputDim(in_RDI);
  pvVar2 = (void *)std::ostream::operator<<(poVar3,iVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t --- Number of experts: ---");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  iVar1 = IMLE<1,_1,_FastLinearExpert>::getNumberOfExperts(in_RDI);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,iVar1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t --- Common Sigma: ---");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  IMLE<1,_1,_FastLinearExpert>::getSigma(in_RDI);
  poVar4 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t --- Common Psi: ---");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  IMLE<1,_1,_FastLinearExpert>::getPsi(in_RDI);
  poVar4 = Eigen::operator<<(in_stack_00000240,in_stack_00000238);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t --- Internal Data: ---");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = operator<<(poVar3,imle_obj);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void cos1D_display( Learner &imleObj)
{
    // Dimensions:
    cout << "Input dimension: "  << imleObj.inputDim() << endl;
    cout << "Output dimension: " << imleObj.outputDim() << endl;

    // Number of Experts
    cout << "\t --- Number of experts: ---" << endl;
    cout << imleObj.getNumberOfExperts() << endl;

    // Common Sigma
    cout << "\t --- Common Sigma: ---" << endl;
    cout << imleObj.getSigma() << endl;

    // Psi
    cout << "\t --- Common Psi: ---" << endl;
    cout << imleObj.getPsi() << endl;

    // Showing internal data
    cout << "\t --- Internal Data: ---" << endl;
    cout << imleObj << endl;
}